

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

void __thiscall data_structures::LinkedList<char>::~LinkedList(LinkedList<char> *this)

{
  ListNode<char> *pLVar1;
  
  this->_vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010bd58;
  while (pLVar1 = this->_header, pLVar1 != this->_tail) {
    deleteFromHeader(this);
  }
  if (pLVar1 != (ListNode<char> *)0x0) {
    (*pLVar1->_vptr_ListNode[1])();
  }
  this->_header = (ListNode<char> *)0x0;
  this->_tail = (ListNode<char> *)0x0;
  this->_size = 0;
  return;
}

Assistant:

inline
    LinkedList<T>::~LinkedList(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        delete _header;
        _header = 0;
        _tail = 0;
        _size = 0;
    }